

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O1

void __thiscall
slang::ast::builtins::ArrayReverseMethod::ArrayReverseMethod(ArrayReverseMethod *this)

{
  string_view sVar1;
  
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00cd12c8;
  sVar1 = parsing::toString(Reverse);
  (this->super_SystemSubroutine).name._M_dataplus._M_p =
       (pointer)&(this->super_SystemSubroutine).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_SystemSubroutine).name,sVar1._M_str,sVar1._M_str + sVar1._M_len
            );
  (this->super_SystemSubroutine).kind = Function;
  (this->super_SystemSubroutine).knownNameId = Reverse;
  (this->super_SystemSubroutine).hasOutputArgs = false;
  (this->super_SystemSubroutine).neverReturns = false;
  (this->super_SystemSubroutine).withClauseMode = None;
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00ccbcf8;
  return;
}

Assistant:

ArrayReverseMethod() : SystemSubroutine(KnownSystemName::Reverse, SubroutineKind::Function) {}